

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O2

void Llb_MtrSchedule(Llb_Mtr_t *p)

{
  int i;
  int iCol;
  long lVar1;
  int iVar2;
  
  for (lVar1 = 0; lVar1 < p->nRows; lVar1 = lVar1 + 1) {
    if ((lVar1 < p->nPis) || ((long)p->nFfs + (long)p->nPis <= lVar1)) {
      p->pProdVars[lVar1] = '\0';
      iVar2 = p->pRowSums[lVar1];
    }
    else {
      p->pProdVars[lVar1] = '\x01';
      iVar2 = p->pRowSums[lVar1] + -1;
    }
    p->pProdNums[lVar1] = iVar2;
  }
  Llb_MtrVerifyMatrix(p);
  for (iVar2 = 1; iVar2 < p->nCols + -1; iVar2 = iVar2 + 1) {
    Llb_MtrVerifyColumns(p,iVar2);
    iCol = Llb_MtrFindBestColumn(p,iVar2);
    Llb_MtrUseSelectedColumn(p,iCol);
    Llb_MtrSwapColumns(p,iVar2,iCol);
  }
  Llb_MtrVerifyMatrix(p);
  return;
}

Assistant:

void Llb_MtrSchedule( Llb_Mtr_t * p )
{
    int iGrp, iGrpBest, i;
    // start partial product
    for ( i = 0; i < p->nRows; i++ )
    {
        if ( i >= p->nPis && i < p->nPis + p->nFfs )
        {
            p->pProdVars[i] = 1;
            p->pProdNums[i] = p->pRowSums[i] - 1;
        }
        else 
        {
            p->pProdVars[i] = 0;
            p->pProdNums[i] = p->pRowSums[i];
        }
    }
    // order the partitions
    Llb_MtrVerifyMatrix( p );
    for ( iGrp = 1; iGrp < p->nCols-1; iGrp++ )
    {
        Llb_MtrVerifyColumns( p, iGrp );
        iGrpBest = Llb_MtrFindBestColumn( p, iGrp );
        Llb_MtrUseSelectedColumn( p, iGrpBest );
        Llb_MtrSwapColumns( p, iGrp, iGrpBest );
    }
    Llb_MtrVerifyMatrix( p );
}